

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVector<ImVec2> *this;
  int points_count;
  ImVec2 *points;
  ImGuiContext *pIVar1;
  ImU32 col_00;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar1 = GImGui;
  local_50.x = (bb->Min).x;
  fVar3 = (bb->Min).y;
  fVar4 = (GImGui->Style).TabRounding;
  fVar2 = ((bb->Max).x - local_50.x) * 0.5 + -1.0;
  if (fVar2 <= fVar4) {
    fVar4 = fVar2;
  }
  local_48 = ZEXT416(~-(uint)(fVar4 <= 0.0) & (uint)fVar4);
  fVar4 = (bb->Max).y + -1.0;
  this = &draw_list->_Path;
  local_50.y = fVar4;
  ImVector<ImVec2>::push_back(this,&local_50);
  local_50.x = (bb->Min).x + (float)local_48._0_4_;
  fVar3 = fVar3 + 1.0 + (float)local_48._0_4_;
  local_50.y = fVar3;
  ImDrawList::PathArcToFast(draw_list,&local_50,(float)local_48._0_4_,6,9);
  local_50.x = (bb->Max).x - (float)local_48._0_4_;
  local_50.y = fVar3;
  ImDrawList::PathArcToFast(draw_list,&local_50,(float)local_48._0_4_,9,0xc);
  local_50.x = (bb->Max).x;
  local_50.y = fVar4;
  ImVector<ImVec2>::push_back(this,&local_50);
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
  if (0.0 < (pIVar1->Style).TabBorderSize) {
    points = (draw_list->_Path).Data;
    points_count = (draw_list->_Path).Size;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline
              (draw_list,points,points_count,col_00,false,(pIVar1->Style).TabBorderSize);
  }
  this->Size = 0;
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    (void)flags;
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    float y1 = bb.Min.y + 1.0f;
    float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->AddConvexPolyFilled(draw_list->_Path.Data, draw_list->_Path.Size, col);
    if (g.Style.TabBorderSize > 0.0f)
        draw_list->AddPolyline(draw_list->_Path.Data, draw_list->_Path.Size, GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    draw_list->PathClear();
}